

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamecore.cpp
# Opt level: O2

bool __thiscall CTuningParams::Get(CTuningParams *this,char *pName,float *pValue)

{
  int iVar1;
  int i;
  ulong uVar2;
  char **ppcVar3;
  
  ppcVar3 = s_apNames;
  uVar2 = 0;
  do {
    if (uVar2 == 0x20) {
LAB_0013f9b9:
      return uVar2 < 0x20;
    }
    iVar1 = str_comp_nocase(pName,*ppcVar3);
    if (iVar1 == 0) {
      *pValue = (float)(&this->m_GroundControlSpeed)[uVar2].m_Value / 100.0;
      goto LAB_0013f9b9;
    }
    uVar2 = uVar2 + 1;
    ppcVar3 = ppcVar3 + 1;
  } while( true );
}

Assistant:

bool CTuningParams::Get(const char *pName, float *pValue) const
{
	for(int i = 0; i < Num(); i++)
		if(str_comp_nocase(pName, GetName(i)) == 0)
			return Get(i, pValue);
	return false;
}